

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

_Bool fnet_socket_sendto(fnet_socket_t sock,char *buf,size_t len,fnet_address_t *addr)

{
  ssize_t sVar1;
  
  if (buf != (char *)0x0) {
    sVar1 = sendto(sock,buf,len,0,(sockaddr *)addr,0x80);
    return (int)sVar1 != -1;
  }
  return false;
}

Assistant:

bool fnet_socket_sendto(fnet_socket_t sock, const char *buf, size_t len, fnet_address_t const *addr)
{
    if (!buf)
    {
        FLOG_ERR("Invalid buffer");
        return false;
    }

    int res = sendto(sock, buf, len, 0, (const struct sockaddr *)addr, sizeof *addr);
    if (res == -1)
    {
        FLOG_ERR("Unable to send data");
        return false;
    }

    return true;
}